

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void FASTCOVER_convertToCoverParams
               (ZDICT_fastCover_params_t fastCoverParams,ZDICT_cover_params_t *coverParams)

{
  ZDICT_cover_params_t *coverParams_local;
  
  coverParams->k = fastCoverParams.k;
  coverParams->d = fastCoverParams.d;
  coverParams->steps = fastCoverParams.steps;
  coverParams->nbThreads = fastCoverParams.nbThreads;
  coverParams->splitPoint = fastCoverParams.splitPoint;
  (coverParams->zParams).compressionLevel = fastCoverParams.zParams.compressionLevel;
  (coverParams->zParams).notificationLevel = fastCoverParams.zParams.notificationLevel;
  (coverParams->zParams).dictID = fastCoverParams.zParams.dictID;
  coverParams->shrinkDict = fastCoverParams.shrinkDict;
  return;
}

Assistant:

static void
FASTCOVER_convertToCoverParams(ZDICT_fastCover_params_t fastCoverParams,
                               ZDICT_cover_params_t* coverParams)
{
    coverParams->k = fastCoverParams.k;
    coverParams->d = fastCoverParams.d;
    coverParams->steps = fastCoverParams.steps;
    coverParams->nbThreads = fastCoverParams.nbThreads;
    coverParams->splitPoint = fastCoverParams.splitPoint;
    coverParams->zParams = fastCoverParams.zParams;
    coverParams->shrinkDict = fastCoverParams.shrinkDict;
}